

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxsteeppr.hpp
# Opt level: O3

int __thiscall soplex::SPxSteepPR<double>::selectLeaveSparse(SPxSteepPR<double> *this,double tol)

{
  double dVar1;
  double dVar2;
  int iVar3;
  int iVar4;
  SPxSolverBase<double> *pSVar5;
  pointer pdVar6;
  pointer pdVar7;
  int *piVar8;
  int iVar9;
  double *pdVar10;
  long lVar11;
  ulong uVar12;
  double dVar13;
  double dVar14;
  
  pSVar5 = (this->super_SPxPricer<double>).thesolver;
  pdVar6 = (pSVar5->theCoTest).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  pdVar7 = (pSVar5->coWeights).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  ::soplex::infinity::__tls_init();
  pSVar5 = (this->super_SPxPricer<double>).thesolver;
  lVar11 = (long)(pSVar5->infeasibilities).super_IdxSet.num;
  if (lVar11 < 1) {
    iVar9 = -1;
  }
  else {
    pdVar10 = (double *)__tls_get_addr(&PTR_003b4b70);
    dVar13 = -*pdVar10;
    piVar8 = (pSVar5->infeasibilities).super_IdxSet.idx;
    uVar12 = lVar11 + 1;
    iVar9 = -1;
    do {
      iVar3 = piVar8[uVar12 - 2];
      dVar1 = pdVar6[iVar3];
      if (-tol <= dVar1) {
        iVar4 = (pSVar5->infeasibilities).super_IdxSet.num;
        (pSVar5->infeasibilities).super_IdxSet.num = iVar4 + -1;
        piVar8[uVar12 - 2] = piVar8[(long)iVar4 + -1];
        (pSVar5->isInfeasible).data[iVar3] = 0;
      }
      else {
        dVar2 = pdVar7[iVar3];
        dVar14 = tol;
        if (tol <= dVar2) {
          dVar14 = dVar2;
        }
        dVar14 = (dVar1 * dVar1) / dVar14;
        if (dVar13 < dVar14) {
          dVar13 = dVar14;
          iVar9 = iVar3;
        }
      }
      uVar12 = uVar12 - 1;
    } while (1 < uVar12);
  }
  return iVar9;
}

Assistant:

int SPxSteepPR<R>::selectLeaveSparse(R tol)
{
   const R* coWeights_ptr = this->thesolver->coWeights.get_const_ptr();
   const R* fTest         = this->thesolver->fTest().get_const_ptr();
   R best = R(-infinity);
   R x;
   int lastIdx = -1;
   int idx;

   for(int i = this->thesolver->infeasibilities.size() - 1; i >= 0; --i)
   {
      idx = this->thesolver->infeasibilities.index(i);
      x = fTest[idx];

      if(x < -tol)
      {
         x = steeppr::computePrice(x, coWeights_ptr[idx], tol);

         if(x > best)
         {
            best = x;
            lastIdx = idx;
         }
      }
      else
      {
         this->thesolver->infeasibilities.remove(i);
         assert(this->thesolver->isInfeasible[idx] == this->VIOLATED
                || this->thesolver->isInfeasible[idx] == this->VIOLATED_AND_CHECKED);
         this->thesolver->isInfeasible[idx] = this->NOT_VIOLATED;
      }
   }

   return lastIdx;
}